

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O3

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *puVar1;
  int iVar2;
  uv_os_sock_t uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uv_timer_t *puVar8;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_stream_t *puVar9;
  code *__addr;
  uv_shutdown_t *puVar10;
  uv_write_t *puVar11;
  uv_connect_t *puVar12;
  uv_tcp_t *puVar13;
  uv_buf_t buf;
  undefined1 auStack_3c0 [16];
  code *pcStack_3b0;
  undefined1 auStack_3a8 [16];
  code *pcStack_398;
  code *pcStack_390;
  code *pcStack_388;
  code *pcStack_380;
  code *pcStack_378;
  undefined1 auStack_368 [16];
  sockaddr sStack_358;
  uv_write_t uStack_348;
  code *pcStack_250;
  sockaddr sStack_240;
  undefined1 auStack_230 [248];
  code *pcStack_138;
  undefined1 auStack_130 [248];
  uv_stream_t *puStack_38;
  undefined1 local_20 [16];
  
  puVar9 = (uv_stream_t *)(ulong)(uint)status;
  local_20 = uv_buf_init("PING",4);
  puVar1 = connect_req.handle;
  if (req == &connect_req) {
    if (status != 0) goto LAB_00180c84;
    connect_cb_called = connect_cb_called + 1;
    iVar2 = uv_write(&write_req,connect_req.handle,local_20,1,write_cb);
    puVar9 = puVar1;
    if (iVar2 != 0) goto LAB_00180c89;
    iVar2 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
    if (iVar2 != 0) goto LAB_00180c8e;
    iVar2 = uv_read_start(puVar1,alloc_cb,read_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    connect_cb_cold_1();
LAB_00180c84:
    connect_cb_cold_2();
LAB_00180c89:
    connect_cb_cold_3();
LAB_00180c8e:
    connect_cb_cold_4();
  }
  connect_cb_cold_5();
  pcStack_138 = (code *)0x180ca6;
  puStack_38 = puVar9;
  uVar3 = create_tcp_socket();
  pcStack_138 = (code *)0x180cad;
  uVar4 = create_tcp_socket();
  uVar7 = (ulong)uVar4;
  pcStack_138 = (code *)0x180cb4;
  uVar6 = uv_default_loop();
  pcStack_138 = (code *)0x180cbf;
  iVar2 = uv_tcp_init(uVar6,auStack_130);
  if (iVar2 == 0) {
    pcStack_138 = (code *)0x180cd1;
    iVar2 = uv_tcp_open(auStack_130,uVar3);
    if (iVar2 != 0) goto LAB_00180d52;
    pcStack_138 = (code *)0x180cdf;
    iVar2 = uv_tcp_open(auStack_130,uVar4);
    if (iVar2 != -0x10) goto LAB_00180d57;
    pcStack_138 = (code *)0x180ceb;
    iVar2 = close(uVar4);
    if (iVar2 != 0) goto LAB_00180d5c;
    pcStack_138 = (code *)0x180cf9;
    uv_close(auStack_130,0);
    pcStack_138 = (code *)0x180cfe;
    uVar6 = uv_default_loop();
    pcStack_138 = (code *)0x180d08;
    uv_run(uVar6,0);
    pcStack_138 = (code *)0x180d0d;
    uVar7 = uv_default_loop();
    pcStack_138 = (code *)0x180d21;
    uv_walk(uVar7,close_walk_cb,0);
    pcStack_138 = (code *)0x180d2b;
    uv_run(uVar7,0);
    pcStack_138 = (code *)0x180d30;
    uVar6 = uv_default_loop();
    pcStack_138 = (code *)0x180d38;
    iVar2 = uv_loop_close(uVar6);
    if (iVar2 == 0) {
      pcStack_138 = (code *)0x180d41;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_138 = (code *)0x180d52;
    run_test_tcp_open_twice_cold_1();
LAB_00180d52:
    pcStack_138 = (code *)0x180d57;
    run_test_tcp_open_twice_cold_2();
LAB_00180d57:
    pcStack_138 = (code *)0x180d5c;
    run_test_tcp_open_twice_cold_3();
LAB_00180d5c:
    pcStack_138 = (code *)0x180d61;
    run_test_tcp_open_twice_cold_4();
  }
  pcStack_138 = run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  pcStack_250 = (code *)0x180d73;
  pcStack_138 = (code *)uVar7;
  uVar4 = create_tcp_socket();
  uVar7 = (ulong)uVar4;
  pcStack_250 = (code *)0x180d8b;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_240);
  if (iVar2 == 0) {
    pcStack_250 = (code *)0x180d98;
    uVar6 = uv_default_loop();
    pcStack_250 = (code *)0x180da5;
    iVar2 = uv_tcp_init(uVar6,auStack_230);
    if (iVar2 != 0) goto LAB_00180e30;
    pcStack_250 = (code *)0x180dbe;
    iVar2 = bind(uVar4,&sStack_240,0x10);
    if (iVar2 != 0) goto LAB_00180e35;
    pcStack_250 = (code *)0x180dce;
    iVar2 = uv_tcp_open(auStack_230,uVar4);
    if (iVar2 != 0) goto LAB_00180e3a;
    pcStack_250 = (code *)0x180de3;
    iVar2 = uv_listen(auStack_230,0x80,0);
    if (iVar2 != 0) goto LAB_00180e3f;
    pcStack_250 = (code *)0x180dec;
    uVar7 = uv_default_loop();
    pcStack_250 = (code *)0x180e00;
    uv_walk(uVar7,close_walk_cb,0);
    pcStack_250 = (code *)0x180e0a;
    uv_run(uVar7,0);
    pcStack_250 = (code *)0x180e0f;
    uVar6 = uv_default_loop();
    pcStack_250 = (code *)0x180e17;
    iVar2 = uv_loop_close(uVar6);
    if (iVar2 == 0) {
      pcStack_250 = (code *)0x180e20;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_250 = (code *)0x180e30;
    run_test_tcp_open_bound_cold_1();
LAB_00180e30:
    pcStack_250 = (code *)0x180e35;
    run_test_tcp_open_bound_cold_2();
LAB_00180e35:
    pcStack_250 = (code *)0x180e3a;
    run_test_tcp_open_bound_cold_3();
LAB_00180e3a:
    pcStack_250 = (code *)0x180e3f;
    run_test_tcp_open_bound_cold_4();
LAB_00180e3f:
    pcStack_250 = (code *)0x180e44;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_250 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_378 = (code *)0x180e62;
  pcStack_250 = (code *)uVar7;
  auStack_368 = uv_buf_init("PING",4);
  puVar10 = (uv_shutdown_t *)0x1a4e6a;
  __addr = (code *)0x23a3;
  pcStack_378 = (code *)0x180e82;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_358);
  if (iVar2 == 0) {
    pcStack_378 = (code *)0x180e8f;
    uVar4 = create_tcp_socket();
    uVar7 = (ulong)uVar4;
    __addr = (code *)&sStack_358;
    puVar10 = (uv_shutdown_t *)(ulong)uVar4;
    pcStack_378 = (code *)0x180ea2;
    iVar2 = connect(uVar4,(sockaddr *)__addr,0x10);
    if (iVar2 != 0) goto LAB_00180fb5;
    pcStack_378 = (code *)0x180eaf;
    puVar10 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)(&sStack_358 + 1);
    pcStack_378 = (code *)0x180ebc;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00180fba;
    puVar10 = (uv_shutdown_t *)(&sStack_358 + 1);
    __addr = (code *)(ulong)uVar4;
    pcStack_378 = (code *)0x180ed0;
    iVar2 = uv_tcp_open();
    if (iVar2 != 0) goto LAB_00180fbf;
    puVar11 = &write_req;
    __addr = (code *)(&sStack_358 + 1);
    pcStack_378 = (code *)0x180efa;
    iVar2 = uv_write(&write_req,__addr,auStack_368,1,write_cb);
    puVar10 = (uv_shutdown_t *)puVar11;
    if (iVar2 != 0) goto LAB_00180fc4;
    puVar10 = &shutdown_req;
    __addr = (code *)(&sStack_358 + 1);
    pcStack_378 = (code *)0x180f1a;
    iVar2 = uv_shutdown(&shutdown_req,__addr,shutdown_cb);
    if (iVar2 != 0) goto LAB_00180fc9;
    __addr = alloc_cb;
    puVar10 = (uv_shutdown_t *)(&sStack_358 + 1);
    pcStack_378 = (code *)0x180f3a;
    iVar2 = uv_read_start(puVar10,alloc_cb,read_cb);
    if (iVar2 != 0) goto LAB_00180fce;
    pcStack_378 = (code *)0x180f47;
    puVar10 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)0x0;
    pcStack_378 = (code *)0x180f51;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_00180fd3;
    if (write_cb_called != 1) goto LAB_00180fd8;
    if (close_cb_called != 1) goto LAB_00180fdd;
    pcStack_378 = (code *)0x180f71;
    uVar7 = uv_default_loop();
    pcStack_378 = (code *)0x180f85;
    uv_walk(uVar7,close_walk_cb,0);
    __addr = (code *)0x0;
    pcStack_378 = (code *)0x180f8f;
    uv_run(uVar7);
    pcStack_378 = (code *)0x180f94;
    puVar10 = (uv_shutdown_t *)uv_default_loop();
    pcStack_378 = (code *)0x180f9c;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      pcStack_378 = (code *)0x180fa5;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_378 = (code *)0x180fb5;
    run_test_tcp_open_connected_cold_1();
LAB_00180fb5:
    pcStack_378 = (code *)0x180fba;
    run_test_tcp_open_connected_cold_2();
LAB_00180fba:
    pcStack_378 = (code *)0x180fbf;
    run_test_tcp_open_connected_cold_3();
LAB_00180fbf:
    pcStack_378 = (code *)0x180fc4;
    run_test_tcp_open_connected_cold_4();
LAB_00180fc4:
    pcStack_378 = (code *)0x180fc9;
    run_test_tcp_open_connected_cold_5();
LAB_00180fc9:
    pcStack_378 = (code *)0x180fce;
    run_test_tcp_open_connected_cold_6();
LAB_00180fce:
    pcStack_378 = (code *)0x180fd3;
    run_test_tcp_open_connected_cold_7();
LAB_00180fd3:
    pcStack_378 = (code *)0x180fd8;
    run_test_tcp_open_connected_cold_8();
LAB_00180fd8:
    pcStack_378 = (code *)0x180fdd;
    run_test_tcp_open_connected_cold_9();
LAB_00180fdd:
    pcStack_378 = (code *)0x180fe2;
    run_test_tcp_open_connected_cold_10();
  }
  pcStack_378 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if ((uv_write_t *)puVar10 == (uv_write_t *)0x0) {
    pcStack_380 = (code *)0x180ffe;
    write_cb_cold_2();
  }
  else if ((int)__addr == 0) {
    write_cb_called = write_cb_called + 1;
    return;
  }
  puVar10 = (uv_shutdown_t *)((ulong)__addr & 0xffffffff);
  pcStack_380 = shutdown_cb;
  write_cb_cold_1();
  if (puVar10 == &shutdown_req) {
    if ((int)__addr == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return;
    }
  }
  else {
    pcStack_388 = (code *)0x181023;
    shutdown_cb_cold_1();
  }
  pcStack_388 = alloc_cb;
  shutdown_cb_cold_2();
  if (__addr < (sockaddr *)0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return;
  }
  pcStack_390 = read_cb;
  alloc_cb_cold_1();
  if (puVar10 == (uv_shutdown_t *)0x0) {
    pcStack_398 = (code *)0x181083;
    read_cb_cold_4();
LAB_00181083:
    pcStack_398 = (code *)0x181088;
    read_cb_cold_2();
LAB_00181088:
    pcStack_398 = (code *)0x18108d;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)__addr) {
      if ((sockaddr *)__addr != (sockaddr *)0x4) goto LAB_00181083;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        return;
      }
      goto LAB_00181088;
    }
    if ((sockaddr *)__addr == (sockaddr *)0xfffffffffffff001) {
      uv_close();
      return;
    }
  }
  pcStack_398 = run_test_tcp_write_ready;
  read_cb_cold_1();
  puVar12 = (uv_connect_t *)0x1a4e6a;
  uVar4 = 0x23a3;
  pcStack_3b0 = (code *)0x1810ab;
  pcStack_398 = (code *)uVar7;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_3a8);
  if (iVar2 == 0) {
    pcStack_3b0 = (code *)0x1810b8;
    uVar5 = create_tcp_socket();
    uVar7 = (ulong)uVar5;
    pcStack_3b0 = (code *)0x1810bf;
    puVar12 = (uv_connect_t *)uv_default_loop();
    uVar4 = 0x335a10;
    pcStack_3b0 = (code *)0x1810ce;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00181193;
    puVar13 = &client;
    pcStack_3b0 = (code *)0x1810e4;
    iVar2 = uv_tcp_open();
    puVar12 = (uv_connect_t *)puVar13;
    if (iVar2 != 0) goto LAB_00181198;
    puVar12 = &connect_req;
    uVar5 = 0x335a10;
    pcStack_3b0 = (code *)0x181109;
    iVar2 = uv_tcp_connect(&connect_req,&client,auStack_3a8,connect1_cb);
    if (iVar2 != 0) goto LAB_0018119d;
    pcStack_3b0 = (code *)0x181116;
    puVar12 = (uv_connect_t *)uv_default_loop();
    uVar5 = 0;
    pcStack_3b0 = (code *)0x181120;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_001811a2;
    if (shutdown_requested != 1) goto LAB_001811a7;
    if (connect_cb_called != 1) goto LAB_001811ac;
    if (write_cb_called < 1) goto LAB_001811b1;
    if (close_cb_called != 1) goto LAB_001811b6;
    pcStack_3b0 = (code *)0x181152;
    uVar7 = uv_default_loop();
    pcStack_3b0 = (code *)0x181166;
    uv_walk(uVar7,close_walk_cb,0);
    uVar5 = 0;
    pcStack_3b0 = (code *)0x181170;
    uv_run(uVar7);
    pcStack_3b0 = (code *)0x181175;
    puVar12 = (uv_connect_t *)uv_default_loop();
    pcStack_3b0 = (code *)0x18117d;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      pcStack_3b0 = (code *)0x181186;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_3b0 = (code *)0x181193;
    run_test_tcp_write_ready_cold_1();
LAB_00181193:
    uVar5 = uVar4;
    pcStack_3b0 = (code *)0x181198;
    run_test_tcp_write_ready_cold_2();
LAB_00181198:
    pcStack_3b0 = (code *)0x18119d;
    run_test_tcp_write_ready_cold_3();
LAB_0018119d:
    pcStack_3b0 = (code *)0x1811a2;
    run_test_tcp_write_ready_cold_4();
LAB_001811a2:
    pcStack_3b0 = (code *)0x1811a7;
    run_test_tcp_write_ready_cold_5();
LAB_001811a7:
    pcStack_3b0 = (code *)0x1811ac;
    run_test_tcp_write_ready_cold_6();
LAB_001811ac:
    pcStack_3b0 = (code *)0x1811b1;
    run_test_tcp_write_ready_cold_7();
LAB_001811b1:
    pcStack_3b0 = (code *)0x1811b6;
    run_test_tcp_write_ready_cold_8();
LAB_001811b6:
    pcStack_3b0 = (code *)0x1811bb;
    run_test_tcp_write_ready_cold_9();
  }
  pcStack_3b0 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar9 = connect_req.handle;
  pcStack_3b0 = (code *)uVar7;
  if (puVar12 == &connect_req) {
    puVar8 = (uv_timer_t *)puVar12;
    if (uVar5 != 0) goto LAB_00181286;
    connect_cb_called = connect_cb_called + 1;
    puVar8 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_timer_init(puVar8,&tm);
    if (iVar2 != 0) goto LAB_0018128b;
    puVar8 = &tm;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar2 != 0) goto LAB_00181290;
    auStack_3c0 = uv_buf_init("P",1);
    puVar11 = &write_req;
    iVar2 = uv_write(&write_req,puVar9,auStack_3c0,1,write1_cb);
    puVar8 = (uv_timer_t *)puVar11;
    if (iVar2 == 0) {
      iVar2 = uv_read_start(puVar9,alloc_cb,read1_cb);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0018129a;
    }
  }
  else {
    connect1_cb_cold_1();
    puVar8 = (uv_timer_t *)puVar12;
LAB_00181286:
    connect1_cb_cold_2();
LAB_0018128b:
    connect1_cb_cold_3();
LAB_00181290:
    connect1_cb_cold_4();
  }
  puVar9 = (uv_stream_t *)puVar8;
  connect1_cb_cold_5();
LAB_0018129a:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(puVar9,0);
  return;
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  int r;

  ASSERT_NOT_NULL(req);
  ASSERT(status == 0);

  /* Not that the server will send anything, but otherwise we'll never know
   * when the server closes the connection. */
  r = uv_read_start((uv_stream_t*)(req->handle), alloc_cb, read_cb);
  ASSERT(r == 0);

  connect_cb_called++;

  free(req);
}